

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.h
# Opt level: O1

Analysis __thiscall spvtools::opt::FixStorageClass::GetPreservedAnalyses(FixStorageClass *this)

{
  return kAnalysisTypes|kAnalysisConstants|kAnalysisNameMap|kAnalysisLoopAnalysis|
         kAnalysisDominatorAnalysis|kAnalysisCFG|kAnalysisCombinators|kAnalysisInstrToBlockMapping|
         kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisCombinators | IRContext::kAnalysisCFG |
           IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisConstants | IRContext::kAnalysisTypes;
  }